

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

bool __thiscall
QIconModeViewBase::filterStartDrag(QIconModeViewBase *this,DropActions supportedActions)

{
  QAbstractItemModel *pQVar1;
  QListViewPrivate *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  QPoint *this_00;
  QWidget *pQVar7;
  QWidget *pQVar8;
  QModelIndex *args;
  long in_FS_OFFSET;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  QArrayData *local_58;
  QModelIndex *pQStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelectionModel::selectedIndexes();
  if (local_48 == (undefined1 *)0x0) goto LAB_0057d8b5;
  bVar3 = QWidget::acceptDrops
                    ((((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
                     super_QAbstractScrollAreaPrivate.viewport);
  if ((bVar3) && (local_48 != (undefined1 *)0x0)) {
    args = pQStack_50;
    do {
      pQVar1 = (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).model;
      uVar6 = (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,args);
      if (((uVar6 & 4) != 0) && (args->c == ((this->super_QCommonListViewBase).dd)->column)) {
        QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
                  ((QMovableArrayOps<QModelIndex> *)&this->draggedItems,(this->draggedItems).d.size,
                   args);
        QList<QModelIndex>::end(&this->draggedItems);
      }
      args = args + 1;
    } while (args != pQStack_50 + (long)local_48);
  }
  local_68 = 0;
  uStack_60 = 0xffffffffffffffff;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemViewPrivate::renderToPixmap
            ((QAbstractItemViewPrivate *)local_88,
             (QModelIndexList *)(this->super_QCommonListViewBase).dd,(QRect *)&local_58);
  iVar4 = (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[0xd])(this);
  iVar5 = (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[0xe])(this);
  local_68._4_4_ = local_68._4_4_ + iVar5;
  local_68._0_4_ = (int)local_68 + iVar4;
  this_00 = (QPoint *)operator_new(0x10);
  QDrag::QDrag((QDrag *)this_00,(QObject *)(this->super_QCommonListViewBase).qq);
  pQVar1 = (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).model;
  (**(code **)(*(long *)pQVar1 + 0xd0))(pQVar1,(QRect *)&local_58);
  QDrag::setMimeData((QMimeData *)this_00);
  QDrag::setPixmap((QPixmap *)this_00);
  QDrag::setHotSpot(this_00);
  pQVar2 = (this->super_QCommonListViewBase).dd;
  (pQVar2->super_QAbstractItemViewPrivate).dropEventMoved = false;
  iVar4 = QDrag::exec(this_00,supportedActions.super_QFlagsStorageHelper<Qt::DropAction,_4>.
                              super_QFlagsStorage<Qt::DropAction>.i,
                      (pQVar2->super_QAbstractItemViewPrivate).defaultDropAction);
  QList<QModelIndex>::clear(&this->draggedItems);
  if ((iVar4 == 2) &&
     (pQVar2 = (this->super_QCommonListViewBase).dd,
     (pQVar2->super_QAbstractItemViewPrivate).dropEventMoved == false)) {
    if ((pQVar2->super_QAbstractItemViewPrivate).dragDropMode == InternalMove) {
      pQVar7 = (QWidget *)QDrag::target();
      pQVar8 = QAbstractScrollArea::viewport
                         ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
      if (pQVar7 != pQVar8) goto LAB_0057d8a0;
    }
    QAbstractItemViewPrivate::clearOrRemove
              (&((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate);
  }
LAB_0057d8a0:
  (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).dropEventMoved = false;
  QPixmap::~QPixmap((QPixmap *)local_88);
LAB_0057d8b5:
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,0x18,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QIconModeViewBase::filterStartDrag(Qt::DropActions supportedActions)
{
    // This function does the same thing as in QAbstractItemView::startDrag(),
    // plus adding viewitems to the draggedItems list.
    // We need these items to draw the drag items
    QModelIndexList indexes = dd->selectionModel->selectedIndexes();
    if (indexes.size() > 0 ) {
        if (viewport()->acceptDrops()) {
            QModelIndexList::ConstIterator it = indexes.constBegin();
            for (; it != indexes.constEnd(); ++it)
                if (dd->model->flags(*it) & Qt::ItemIsDragEnabled
                    && (*it).column() == dd->column)
                    draggedItems.push_back(*it);
        }

        QRect rect;
        QPixmap pixmap = dd->renderToPixmap(indexes, &rect);
        rect.adjust(horizontalOffset(), verticalOffset(), 0, 0);
        QDrag *drag = new QDrag(qq);
        drag->setMimeData(dd->model->mimeData(indexes));
        drag->setPixmap(pixmap);
        drag->setHotSpot(dd->pressedPosition - rect.topLeft());
        dd->dropEventMoved = false;
        Qt::DropAction action = drag->exec(supportedActions, dd->defaultDropAction);
        draggedItems.clear();
        // delete item, unless it has already been moved internally (see filterDropEvent)
        if (action == Qt::MoveAction && !dd->dropEventMoved) {
            if (dd->dragDropMode != QAbstractItemView::InternalMove || drag->target() == qq->viewport())
                dd->clearOrRemove();
        }
        dd->dropEventMoved = false;
    }
    return true;
}